

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

void Fra_ClauMinimizeClause_rec(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  uint uVar1;
  int nSizeNew;
  int iVar2;
  Vec_Int_t *vVec2;
  int i;
  ulong uVar3;
  
  while( true ) {
    uVar1 = vExtra->nSize;
    if (uVar1 == 1) {
      return;
    }
    if ((int)uVar1 < 2) break;
    nSizeNew = vBasis->nSize;
    vVec2 = Vec_IntAlloc((uVar1 >> 1) + 1);
    iVar2 = vExtra->nSize;
    uVar3 = (long)iVar2 / 2 & 0xffffffff;
    while (i = (int)uVar3, i < iVar2) {
      iVar2 = Vec_IntEntry(vExtra,i);
      Vec_IntPush(vVec2,iVar2);
      iVar2 = vExtra->nSize;
      uVar3 = (ulong)(i + 1);
    }
    Vec_IntShrink(vExtra,iVar2 / 2);
    Vec_IntAppend(vBasis,vExtra);
    iVar2 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
    Vec_IntShrink(vBasis,nSizeNew);
    if (iVar2 == 0) {
      Vec_IntAppend(vBasis,vVec2);
      iVar2 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
      if (iVar2 == 0) {
        Fra_ClauMinimizeClause_rec(p,vBasis,vExtra);
        Vec_IntShrink(vBasis,nSizeNew);
        Vec_IntAppend(vBasis,vExtra);
        Fra_ClauMinimizeClause_rec(p,vBasis,vVec2);
        Vec_IntShrink(vBasis,nSizeNew);
        Vec_IntAppend(vExtra,vVec2);
        Vec_IntFree(vVec2);
        return;
      }
      Vec_IntShrink(vBasis,nSizeNew);
      vExtra = vVec2;
    }
  }
  __assert_fail("Vec_IntSize(vVec) > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                ,0x134,"Vec_Int_t *Vec_IntSplitHalf(Vec_Int_t *)");
}

Assistant:

void Fra_ClauMinimizeClause_rec( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    Vec_Int_t * vExtra2;
    int nSizeOld;
    if ( Vec_IntSize(vExtra) == 1 )
        return;
    nSizeOld = Vec_IntSize( vBasis );
    vExtra2 = Vec_IntSplitHalf( vExtra );

    // try the first half
    Vec_IntAppend( vBasis, vExtra );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
        return;
    }
    Vec_IntShrink( vBasis, nSizeOld );

    // try the second half
    Vec_IntAppend( vBasis, vExtra2 );
    if ( Fra_ClauCheckClause( p, vBasis, NULL ) )
    {
        Vec_IntShrink( vBasis, nSizeOld );
        Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
        return;
    }
//    Vec_IntShrink( vBasis, nSizeOld );

    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vBasis, vExtra );
    // find the smallest with the second half added
    Fra_ClauMinimizeClause_rec( p, vBasis, vExtra2 );
    Vec_IntShrink( vBasis, nSizeOld );
    Vec_IntAppend( vExtra, vExtra2 );
    Vec_IntFree( vExtra2 );
}